

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# milo.c
# Opt level: O0

void milo_free(milo_value *v)

{
  milo_type mVar1;
  ulong local_18;
  size_t i;
  milo_value *v_local;
  
  if (v == (milo_value *)0x0) {
    __assert_fail("v!= NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/milo.c",
                  0x1cc,"void milo_free(milo_value *)");
  }
  mVar1 = v->type;
  if (mVar1 == MILO_STRING) {
    free((v->u).o.m);
  }
  else if (mVar1 == MILO_ARRAY) {
    for (local_18 = 0; local_18 < (v->u).o.size; local_18 = local_18 + 1) {
      milo_free((milo_value *)(&((v->u).o.m)->k + local_18 * 3));
    }
    free((v->u).o.m);
  }
  else if (mVar1 == MILO_OBJECT) {
    for (local_18 = 0; local_18 < (v->u).o.size; local_18 = local_18 + 1) {
      free((v->u).o.m[local_18].k);
      milo_free(&(v->u).o.m[local_18].v);
    }
    free((v->u).o.m);
  }
  v->type = MILO_NULL;
  return;
}

Assistant:

void milo_free(milo_value* v) {
    size_t  i;
    assert( v!= NULL);
    switch (v->type) {
        case MILO_STRING:
            free(v->u.s.s);
            break;
        case MILO_ARRAY:
            for (i = 0; i < v->u.a.size; i++)
                milo_free(&v->u.a.e[i]);
            free(v->u.a.e);
            break;
        case MILO_OBJECT:
            for (i = 0; i < v->u.o.size; i++) {
                free(v->u.o.m[i].k);
                milo_free(&v->u.o.m[i].v);
            }
            free(v->u.o.m);
            break;
        default: break;
    }
    v->type = MILO_NULL;
}